

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::image_atomic
               (NegativeTestContext *ctx,TextureType imageType)

{
  int local_c8;
  int local_c4;
  int functionNdx;
  int fmtNdx;
  int memoryNdx;
  allocator<char> local_a9;
  string local_a8;
  undefined8 uStack_88;
  ImageOperation imageOperations [7];
  MemoryQualifier memoryOptions [3];
  TextureFormat formats [8];
  TextureType imageType_local;
  NegativeTestContext *ctx_local;
  
  formats[7].type = imageType;
  tcu::TextureFormat::TextureFormat((TextureFormat *)(memoryOptions + 2),RGBA,SIGNED_INT32);
  tcu::TextureFormat::TextureFormat(formats,RGBA,SIGNED_INT16);
  tcu::TextureFormat::TextureFormat(formats + 1,RGBA,SIGNED_INT8);
  tcu::TextureFormat::TextureFormat(formats + 2,R,SIGNED_INT32);
  tcu::TextureFormat::TextureFormat(formats + 3,RGBA,UNSIGNED_INT32);
  tcu::TextureFormat::TextureFormat(formats + 4,RGBA,UNSIGNED_INT16);
  tcu::TextureFormat::TextureFormat(formats + 5,RGBA,UNSIGNED_INT8);
  tcu::TextureFormat::TextureFormat(formats + 6,R,UNSIGNED_INT32);
  stack0xffffffffffffff98 = 0x200000001;
  memoryOptions[0] = MEMORY_BOTH;
  imageOperations[2] = IMAGE_OPERATION_ATOMIC_OR;
  imageOperations[3] = IMAGE_OPERATION_ATOMIC_XOR;
  imageOperations[4] = IMAGE_OPERATION_ATOMIC_COMP_SWAP;
  uStack_88 = 0x300000002;
  imageOperations[0] = IMAGE_OPERATION_ATOMIC_MAX;
  imageOperations[1] = IMAGE_OPERATION_ATOMIC_AND;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,
             "It is an error to pass a writeonly and/or readonly image to imageAtomic*.",&local_a9);
  NegativeTestContext::beginSection(ctx,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  for (functionNdx = 0; functionNdx < 3; functionNdx = functionNdx + 1) {
    for (local_c4 = 0; local_c4 < 8; local_c4 = local_c4 + 1) {
      for (local_c8 = 0; local_c8 < 7; local_c8 = local_c8 + 1) {
        testShader(ctx,imageOperations[(long)local_c8 + -2],imageOperations[(long)functionNdx + 6],
                   formats[7].type,(TextureFormat *)(memoryOptions + (long)local_c4 * 2 + 2));
      }
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void image_atomic (NegativeTestContext& ctx, glu::TextureTestUtil::TextureType imageType)
{
	const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::SIGNED_INT32),

		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::UNSIGNED_INT32)
	};

	const MemoryQualifier memoryOptions[] =
	{
		MEMORY_READONLY,
		MEMORY_WRITEONLY,
		MEMORY_BOTH
	};

	const ImageOperation imageOperations[] =
	{
		IMAGE_OPERATION_ATOMIC_ADD,
		IMAGE_OPERATION_ATOMIC_MIN,
		IMAGE_OPERATION_ATOMIC_MAX,
		IMAGE_OPERATION_ATOMIC_AND,
		IMAGE_OPERATION_ATOMIC_OR,
		IMAGE_OPERATION_ATOMIC_XOR,
		IMAGE_OPERATION_ATOMIC_COMP_SWAP
	};

	ctx.beginSection("It is an error to pass a writeonly and/or readonly image to imageAtomic*.");
	for (int memoryNdx = 0; memoryNdx < DE_LENGTH_OF_ARRAY(memoryOptions); ++memoryNdx)
	{
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(formats); ++fmtNdx)
		{
			for (int functionNdx = 0; functionNdx < DE_LENGTH_OF_ARRAY(imageOperations); ++functionNdx)
			{
				testShader(ctx, imageOperations[functionNdx], memoryOptions[memoryNdx], imageType, formats[fmtNdx]);
			}
		}
	}
	ctx.endSection();
}